

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function_set.cpp
# Opt level: O1

void __thiscall
duckdb::CastFunctionSet::RegisterCastFunction
          (CastFunctionSet *this,LogicalType *source,LogicalType *target,MapCastNode *node)

{
  MapCastInfo *this_00;
  templated_unique_single_t info;
  _Head_base<0UL,_duckdb::MapCastInfo_*,_false> local_50;
  MapCastNode local_48;
  
  if ((this->map_info).ptr == (MapCastInfo *)0x0) {
    local_50._M_head_impl = (MapCastInfo *)operator_new(0x40);
    ((local_50._M_head_impl)->super_BindCastInfo)._vptr_BindCastInfo = (_func_int **)0x0;
    ((local_50._M_head_impl)->casts)._M_h._M_buckets = (__buckets_ptr)0x0;
    ((local_50._M_head_impl)->casts)._M_h._M_bucket_count = 0;
    ((local_50._M_head_impl)->casts)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    ((local_50._M_head_impl)->casts)._M_h._M_element_count = 0;
    *(undefined8 *)&((local_50._M_head_impl)->casts)._M_h._M_rehash_policy = 0;
    ((local_50._M_head_impl)->casts)._M_h._M_rehash_policy._M_next_resize = 0;
    ((local_50._M_head_impl)->casts)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    ((local_50._M_head_impl)->super_BindCastInfo)._vptr_BindCastInfo =
         (_func_int **)&PTR__MapCastInfo_019b2538;
    ((local_50._M_head_impl)->casts)._M_h._M_buckets =
         &((local_50._M_head_impl)->casts)._M_h._M_single_bucket;
    ((local_50._M_head_impl)->casts)._M_h._M_bucket_count = 1;
    ((local_50._M_head_impl)->casts)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    ((local_50._M_head_impl)->casts)._M_h._M_element_count = 0;
    ((local_50._M_head_impl)->casts)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (this->map_info).ptr = local_50._M_head_impl;
    ::std::vector<duckdb::BindCastFunction,std::allocator<duckdb::BindCastFunction>>::
    emplace_back<duckdb::BoundCastInfo(&)(duckdb::BindCastInput&,duckdb::LogicalType_const&,duckdb::LogicalType_const&),duckdb::unique_ptr<duckdb::MapCastInfo,std::default_delete<duckdb::MapCastInfo>,true>>
              ((vector<duckdb::BindCastFunction,std::allocator<duckdb::BindCastFunction>> *)
               &this->bind_functions,MapCastFunction,
               (unique_ptr<duckdb::MapCastInfo,_std::default_delete<duckdb::MapCastInfo>,_true> *)
               &local_50);
    if (local_50._M_head_impl != (MapCastInfo *)0x0) {
      (*((local_50._M_head_impl)->super_BindCastInfo)._vptr_BindCastInfo[1])();
    }
  }
  optional_ptr<duckdb::MapCastInfo,_true>::CheckValid(&this->map_info);
  this_00 = (this->map_info).ptr;
  local_48.cast_info.function = (node->cast_info).function;
  local_48.cast_info.init_local_state = (node->cast_info).init_local_state;
  local_48.cast_info.cast_data.
  super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
  super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
       (node->cast_info).cast_data.
       super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
       super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
  (node->cast_info).cast_data.
  super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
  super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl = (BoundCastData *)0x0;
  local_48.bind_function = node->bind_function;
  local_48.implicit_cast_cost = node->implicit_cast_cost;
  MapCastInfo::AddEntry(this_00,source,target,&local_48);
  if (local_48.cast_info.cast_data.
      super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_48.cast_info.cast_data.
        super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
        super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
        .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl)[1])();
  }
  return;
}

Assistant:

void CastFunctionSet::RegisterCastFunction(const LogicalType &source, const LogicalType &target, MapCastNode node) {
	if (!map_info) {
		// create the cast map and the cast map function
		auto info = make_uniq<MapCastInfo>();
		map_info = info.get();
		bind_functions.emplace_back(MapCastFunction, std::move(info));
	}
	map_info->AddEntry(source, target, std::move(node));
}